

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextboundaryfinder.cpp
# Opt level: O0

qsizetype __thiscall QTextBoundaryFinder::toNextBoundary(QTextBoundaryFinder *this)

{
  long lVar1;
  qsizetype qVar2;
  undefined4 *in_RDI;
  bool bVar3;
  qsizetype local_8;
  
  if (((*(long *)(in_RDI + 0x10) == 0) || (*(long *)(in_RDI + 0xc) < 0)) ||
     (lVar1 = *(long *)(in_RDI + 0xc), qVar2 = QStringView::size((QStringView *)(in_RDI + 8)),
     qVar2 <= lVar1)) {
    *(undefined8 *)(in_RDI + 0xc) = 0xffffffffffffffff;
    local_8 = *(qsizetype *)(in_RDI + 0xc);
  }
  else {
    *(long *)(in_RDI + 0xc) = *(long *)(in_RDI + 0xc) + 1;
    switch(*in_RDI) {
    case 0:
      while( true ) {
        lVar1 = *(long *)(in_RDI + 0xc);
        qVar2 = QStringView::size((QStringView *)(in_RDI + 8));
        bVar3 = false;
        if (lVar1 < qVar2) {
          bVar3 = (*(byte *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0xc)) & 1) == 0;
        }
        if (!bVar3) break;
        *(long *)(in_RDI + 0xc) = *(long *)(in_RDI + 0xc) + 1;
      }
      break;
    case 1:
      while( true ) {
        lVar1 = *(long *)(in_RDI + 0xc);
        qVar2 = QStringView::size((QStringView *)(in_RDI + 8));
        bVar3 = false;
        if (lVar1 < qVar2) {
          bVar3 = (*(byte *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0xc)) >> 1 & 1) == 0;
        }
        if (!bVar3) break;
        *(long *)(in_RDI + 0xc) = *(long *)(in_RDI + 0xc) + 1;
      }
      break;
    case 2:
      while( true ) {
        lVar1 = *(long *)(in_RDI + 0xc);
        qVar2 = QStringView::size((QStringView *)(in_RDI + 8));
        bVar3 = false;
        if (lVar1 < qVar2) {
          bVar3 = (*(byte *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0xc)) >> 2 & 1) == 0;
        }
        if (!bVar3) break;
        *(long *)(in_RDI + 0xc) = *(long *)(in_RDI + 0xc) + 1;
      }
      break;
    case 3:
      while( true ) {
        lVar1 = *(long *)(in_RDI + 0xc);
        qVar2 = QStringView::size((QStringView *)(in_RDI + 8));
        bVar3 = false;
        if (lVar1 < qVar2) {
          bVar3 = (*(byte *)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0xc)) >> 3 & 1) == 0;
        }
        if (!bVar3) break;
        *(long *)(in_RDI + 0xc) = *(long *)(in_RDI + 0xc) + 1;
      }
    }
    local_8 = *(qsizetype *)(in_RDI + 0xc);
  }
  return local_8;
}

Assistant:

qsizetype QTextBoundaryFinder::toNextBoundary()
{
    if (!attributes || pos < 0 || pos >= sv.size()) {
        pos = -1;
        return pos;
    }

    ++pos;
    switch(t) {
    case Grapheme:
        while (pos < sv.size() && !attributes[pos].graphemeBoundary)
            ++pos;
        break;
    case Word:
        while (pos < sv.size() && !attributes[pos].wordBreak)
            ++pos;
        break;
    case Sentence:
        while (pos < sv.size() && !attributes[pos].sentenceBoundary)
            ++pos;
        break;
    case Line:
        while (pos < sv.size() && !attributes[pos].lineBreak)
            ++pos;
        break;
    }

    return pos;
}